

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,float power)

{
  bool bVar1;
  ImGuiSliderFlags drag_flags;
  char *in_stack_00000168;
  void *in_stack_00000170;
  void *in_stack_00000178;
  float in_stack_00000184;
  void *in_stack_00000188;
  ImGuiDataType in_stack_00000194;
  char *in_stack_00000198;
  ImGuiSliderFlags in_stack_000001b0;
  
  bVar1 = DragScalar(in_stack_00000198,in_stack_00000194,in_stack_00000188,in_stack_00000184,
                     in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_000001b0);
  return bVar1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalar(label, data_type, p_data, v_speed, p_min, p_max, format, drag_flags);
}